

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listener.c
# Opt level: O2

int nni_listener_setopt(nni_listener *l,char *name,void *val,size_t sz,nni_type t)

{
  _func_int_void_ptr_char_ptr_void_ptr_size_t_nni_type *p_Var1;
  int iVar2;
  nni_option *pnVar3;
  
  p_Var1 = (l->l_ops).l_setopt;
  if ((p_Var1 != (_func_int_void_ptr_char_ptr_void_ptr_size_t_nni_type *)0x0) &&
     (iVar2 = (*p_Var1)(l->l_data,name,val,sz,t), iVar2 != 9)) {
    return iVar2;
  }
  pnVar3 = (l->l_ops).l_options;
  while( true ) {
    if (pnVar3 == (nni_option *)0x0) {
      return 9;
    }
    if (pnVar3->o_name == (char *)0x0) break;
    iVar2 = strcmp(pnVar3->o_name,name);
    if (iVar2 == 0) {
      if (pnVar3->o_set == (_func_int_void_ptr_void_ptr_size_t_nni_type *)0x0) {
        return 0x18;
      }
      iVar2 = (*pnVar3->o_set)(l->l_data,val,sz,t);
      return iVar2;
    }
    pnVar3 = pnVar3 + 1;
  }
  return 9;
}

Assistant:

int
nni_listener_setopt(
    nni_listener *l, const char *name, const void *val, size_t sz, nni_type t)
{
	nni_option *o;

	if (l->l_ops.l_setopt != NULL) {
		int rv = l->l_ops.l_setopt(l->l_data, name, val, sz, t);
		if (rv != NNG_ENOTSUP) {
			return (rv);
		}
	}

	for (o = l->l_ops.l_options; o && o->o_name; o++) {
		if (strcmp(o->o_name, name) != 0) {
			continue;
		}
		if (o->o_set == NULL) {
			return (NNG_EREADONLY);
		}

		return (o->o_set(l->l_data, val, sz, t));
	}

	return (NNG_ENOTSUP);
}